

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O0

void ecs_bulk_remove_type(ecs_world_t *world,ecs_type_t to_remove,ecs_filter_t *filter)

{
  ecs_sparse_t *peVar1;
  long lVar2;
  ecs_table_t *src_table;
  int32_t dense_index;
  ecs_type_t peVar3;
  _Bool _Var4;
  ecs_stage_t *peVar5;
  ecs_table_t *peVar6;
  int iVar7;
  bool bVar8;
  ecs_entities_t eVar9;
  ecs_entity_t aeStack_70 [2];
  ecs_table_t *local_60;
  ecs_table_t *dst_table;
  ecs_table_t *table;
  int32_t count;
  int32_t i;
  ecs_entities_t removed;
  ecs_entities_t to_remove_array;
  ecs_stage_t *stage;
  ecs_filter_t *filter_local;
  ecs_type_t to_remove_local;
  ecs_world_t *world_local;
  
  aeStack_70[0] = 0x147d34;
  to_remove_local = (ecs_type_t)world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xfe);
  if (to_remove_local == (ecs_type_t)0x0) {
    aeStack_70[0] = 0x147d5c;
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0xfe,"void ecs_bulk_remove_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)"
                 );
  }
  aeStack_70[0] = 0x147d8c;
  _ecs_assert(to_remove != (ecs_type_t)0x0,2,(char *)0x0,"to_remove != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xff);
  if (to_remove == (ecs_type_t)0x0) {
    aeStack_70[0] = 0x147db4;
    __assert_fail("to_remove != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0xff,"void ecs_bulk_remove_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)"
                 );
  }
  aeStack_70[0] = 0x147dbd;
  peVar5 = ecs_get_stage((ecs_world_t **)&to_remove_local);
  aeStack_70[0] = 0x147dfe;
  _ecs_assert(peVar5 == (ecs_stage_t *)&to_remove_local[0x5b0].elem_size,0x23,(char *)0x0,
              "stage == &world->stage",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0x102);
  if (peVar5 != (ecs_stage_t *)&to_remove_local[0x5b0].elem_size) {
    aeStack_70[0] = 0x147e33;
    __assert_fail("stage == &world->stage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0x102,
                  "void ecs_bulk_remove_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)");
  }
  aeStack_70[0] = 0x147e3c;
  eVar9 = ecs_type_to_entities(to_remove);
  removed._8_8_ = eVar9.array;
  iVar7 = eVar9.count;
  lVar2 = -((long)(iVar7 << 3) + 0xfU & 0xfffffffffffffff0);
  _count = (ecs_entity_t *)((long)aeStack_70 + lVar2 + 8);
  removed.array._0_4_ = 0;
  peVar1 = *(ecs_sparse_t **)(to_remove_local + 0x483);
  *(undefined8 *)((long)aeStack_70 + lVar2) = 0x147e78;
  table._0_4_ = ecs_sparse_count(peVar1);
  table._4_4_ = 0;
  do {
    dense_index = table._4_4_;
    if ((int32_t)table <= table._4_4_) {
      return;
    }
    peVar1 = *(ecs_sparse_t **)(to_remove_local + 0x483);
    *(undefined8 *)((long)aeStack_70 + lVar2) = 0x147ea6;
    peVar6 = (ecs_table_t *)_ecs_sparse_get(peVar1,0x80,dense_index);
    peVar3 = to_remove_local;
    dst_table = peVar6;
    if ((peVar6->flags & 1) == 0) {
      *(undefined8 *)((long)aeStack_70 + lVar2) = 0x147ecf;
      _Var4 = ecs_table_match_filter((ecs_world_t *)peVar3,peVar6,filter);
      peVar3 = to_remove_local;
      peVar6 = dst_table;
      if (_Var4) {
        *(undefined8 *)((long)aeStack_70 + lVar2) = 0x147eed;
        local_60 = ecs_table_traverse_remove
                             ((ecs_world_t *)peVar3,peVar6,(ecs_entities_t *)&removed.count,
                              (ecs_entities_t *)&count);
        bVar8 = (int)removed.array <= iVar7;
        *(undefined8 *)((long)aeStack_70 + lVar2) = 0x147f22;
        _ecs_assert(bVar8,0xc,(char *)0x0,"removed.count <= to_remove_array.count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                    ,0x11a);
        if (iVar7 < (int)removed.array) {
          *(undefined8 *)((long)aeStack_70 + lVar2) = 0x147f4b;
          __assert_fail("removed.count <= to_remove_array.count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0x11a,
                        "void ecs_bulk_remove_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)"
                       );
        }
        if ((int)removed.array != 0) {
          bVar8 = local_60 != (ecs_table_t *)0x0;
          *(undefined8 *)((long)aeStack_70 + lVar2) = 0x147f83;
          _ecs_assert(bVar8,0xc,(char *)0x0,"dst_table != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                      ,0x120);
          peVar3 = to_remove_local;
          src_table = dst_table;
          peVar6 = local_60;
          if (local_60 == (ecs_table_t *)0x0) {
            *(undefined8 *)((long)aeStack_70 + lVar2) = 0x147fab;
            __assert_fail("dst_table != ((void*)0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                          ,0x120,
                          "void ecs_bulk_remove_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)"
                         );
          }
          *(undefined8 *)((long)aeStack_70 + lVar2) = 0x147fc4;
          merge_table((ecs_world_t *)peVar3,peVar6,src_table,(ecs_entities_t *)0x0,
                      (ecs_entities_t *)&count);
          removed.array._0_4_ = 0;
        }
      }
    }
    table._4_4_ = table._4_4_ + 1;
  } while( true );
}

Assistant:

void ecs_bulk_remove_type(
    ecs_world_t *world,
    ecs_type_t to_remove,
    const ecs_filter_t *filter)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(to_remove != NULL, ECS_INVALID_PARAMETER, NULL);

    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_assert(stage == &world->stage, ECS_UNSUPPORTED, NULL);
    (void)stage;

    ecs_entities_t to_remove_array = ecs_type_to_entities(to_remove);
    ecs_entities_t removed = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * to_remove_array.count),
        .count = 0
    };

    int32_t i, count = ecs_sparse_count(world->store.tables);
    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(world->store.tables, ecs_table_t, i);

        if (table->flags & EcsTableHasBuiltins) {
            continue;
        }

        if (!ecs_table_match_filter(world, table, filter)) {
            continue;
        }
        
        ecs_table_t *dst_table = ecs_table_traverse_remove(
            world, table, &to_remove_array, &removed);

        ecs_assert(removed.count <= to_remove_array.count, ECS_INTERNAL_ERROR, NULL);

        if (!removed.count) {
            continue;
        }

        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);
        merge_table(world, dst_table, table, NULL, &removed);
        removed.count = 0;        
    }    
}